

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintDouble
          (FastFieldValuePrinter *this,double val,BaseTextGenerator *generator)

{
  string local_28;
  
  if (NAN(val)) {
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_28,"nan","");
  }
  else {
    io::SimpleDtoa_abi_cxx11_(&local_28,(io *)generator,val);
  }
  (*generator->_vptr_BaseTextGenerator[5])
            (generator,local_28._M_dataplus._M_p,local_28._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintDouble(
    double val, BaseTextGenerator* generator) const {
  generator->PrintString(!std::isnan(val) ? io::SimpleDtoa(val) : "nan");
}